

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestProtocols.h
# Opt level: O0

void __thiscall B::B(B *this,ostream *outStream)

{
  ostream *outStream_local;
  B *this_local;
  
  StreamWriter::StreamWriter(&this->super_StreamWriter,outStream);
  FooBarProtocol::FooBarProtocol(&this->super_FooBarProtocol);
  TicTacProtocol::TicTacProtocol(&this->super_TicTacProtocol);
  (this->super_FooBarProtocol).super_BaseObserverProtocol._vptr_BaseObserverProtocol =
       (_func_int **)&PTR__B_001debe8;
  (this->super_TicTacProtocol).super_BaseObserverProtocol._vptr_BaseObserverProtocol =
       (_func_int **)&PTR__B_001dec20;
  return;
}

Assistant:

B(std::ostream& outStream) :
    StreamWriter(outStream) {}